

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

StringView __thiscall
Corrade::Containers::String::findOr(String *this,StringView substring,char *fail)

{
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> local_30;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&local_30,this);
  BVar1 = BasicStringView<const_char>::findOr(&local_30,substring,fail);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findOr(const StringView substring, const char* const fail) const {
    return StringView{*this}.findOr(substring, fail);
}